

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O0

apx_error_t
apx_nodeManager_build_node_from_data(apx_nodeManager_t *self,apx_nodeInstance_t *node_instance)

{
  apx_size_t aVar1;
  apx_nodeData_t *self_00;
  uint8_t *begin;
  apx_node_t *node_00;
  char *pKey;
  char *name;
  apx_node_t *node;
  apx_error_t result;
  uint8_t *definition_data;
  size_t definition_size;
  apx_nodeData_t *node_data;
  apx_nodeInstance_t *node_instance_local;
  apx_nodeManager_t *self_local;
  
  if ((self == (apx_nodeManager_t *)0x0) || (node_instance == (apx_nodeInstance_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    self_00 = apx_nodeInstance_get_node_data(node_instance);
    if (self_00 == (apx_nodeData_t *)0x0) {
      self_local._4_4_ = 0x24;
    }
    else {
      aVar1 = apx_nodeData_definition_data_size(self_00);
      if ((ulong)aVar1 == 0) {
        self_local._4_4_ = 7;
      }
      else {
        begin = apx_nodeData_take_definition_data_snapshot(self_00);
        if (begin == (uint8_t *)0x0) {
          self_local._4_4_ = 2;
        }
        else {
          node._4_4_ = apx_parser_parse_bstr(&self->parser,begin,begin + aVar1);
          free(begin);
          if (node._4_4_ == 0) {
            node_00 = apx_parser_take_last_node(&self->parser);
            if (node_00 == (apx_node_t *)0x0) {
              __assert_fail("node != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                            ,0xb5,
                            "apx_error_t apx_nodeManager_build_node_from_data(apx_nodeManager_t *, apx_nodeInstance_t *)"
                           );
            }
            node._4_4_ = build_node_instance(self,node_instance,node_00);
            apx_node_delete(node_00);
          }
          if ((node._4_4_ != 0) &&
             (pKey = apx_nodeInstance_get_name(node_instance), pKey != (char *)0x0)) {
            adt_hash_remove(&self->instance_map,pKey);
            apx_nodeInstance_delete(node_instance);
          }
          self_local._4_4_ = node._4_4_;
        }
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_nodeManager_build_node_from_data(apx_nodeManager_t* self, apx_nodeInstance_t* node_instance)
{
   if (self != NULL && (node_instance != NULL))
   {
      apx_nodeData_t* node_data = apx_nodeInstance_get_node_data(node_instance);
      if (node_data == NULL)
      {
         return APX_NULL_PTR_ERROR;
      }
      size_t definition_size = (size_t)apx_nodeData_definition_data_size(node_data);
      if (definition_size == 0u)
      {
         return APX_LENGTH_ERROR;
      }
      uint8_t* definition_data = apx_nodeData_take_definition_data_snapshot(node_data);
      if (definition_data == NULL)
      {
         return APX_MEM_ERROR;
      }
      apx_error_t result = apx_parser_parse_bstr(&self->parser, definition_data, definition_data + definition_size);
      apx_node_t* node = NULL;
      free(definition_data);
      if (result == APX_NO_ERROR)
      {
         node = apx_parser_take_last_node(&self->parser);
         assert(node != NULL);
         result = build_node_instance(self, node_instance, node);
         apx_node_delete(node);
      }
      if (result != APX_NO_ERROR)
      {
         char const* name = apx_nodeInstance_get_name(node_instance);
         if (name != NULL)
         {
            adt_hash_remove(&self->instance_map, name);
            apx_nodeInstance_delete(node_instance);
         }
      }
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}